

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::anon_unknown_14::ConsoleReporter::logTestStart(ConsoleReporter *this)

{
  size_type sVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  size_type sVar5;
  String *pSVar6;
  long *in_RDI;
  size_t i_1;
  size_t i;
  undefined4 in_stack_ffffffffffffffb8;
  Enum in_stack_ffffffffffffffbc;
  ostream *in_stack_ffffffffffffffc0;
  String *in_stack_ffffffffffffffc8;
  String *this_00;
  String *local_18;
  ulong local_10;
  
  if ((*(byte *)(in_RDI + 2) & 1) == 0) {
    separator_to_stream((ConsoleReporter *)0x125538);
    pcVar3 = String::c_str((String *)0x125546);
    (**(code **)(*in_RDI + 0x70))(in_RDI,pcVar3,*(undefined4 *)(in_RDI[0xd] + 0x18),"\n");
    if (*(long *)(in_RDI[0xd] + 0x30) != 0) {
      poVar4 = Color::operator<<(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      std::operator<<(poVar4,"DESCRIPTION: ");
      poVar4 = Color::operator<<(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      poVar4 = std::operator<<(poVar4,*(char **)(in_RDI[0xd] + 0x30));
      std::operator<<(poVar4,"\n");
    }
    if ((*(long *)(in_RDI[0xd] + 0x28) != 0) && (**(char **)(in_RDI[0xd] + 0x28) != '\0')) {
      poVar4 = Color::operator<<(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      std::operator<<(poVar4,"TEST SUITE: ");
      poVar4 = Color::operator<<(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      poVar4 = std::operator<<(poVar4,*(char **)(in_RDI[0xd] + 0x28));
      std::operator<<(poVar4,"\n");
    }
    iVar2 = strncmp(*(char **)(in_RDI[0xd] + 0x20),"  Scenario:",0xb);
    if (iVar2 != 0) {
      poVar4 = Color::operator<<(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      std::operator<<(poVar4,"TEST CASE:  ");
    }
    poVar4 = Color::operator<<(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    poVar4 = std::operator<<(poVar4,*(char **)(in_RDI[0xd] + 0x20));
    std::operator<<(poVar4,"\n");
    for (local_10 = 0; local_10 < (ulong)in_RDI[6]; local_10 = local_10 + 1) {
      std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::operator[]
                ((vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_> *)
                 (in_RDI + 3),local_10);
      pcVar3 = String::operator[](in_stack_ffffffffffffffc8,
                                  (uint)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
      if (*pcVar3 != '\0') {
        std::operator<<((ostream *)in_RDI[1],"  ");
        std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::
        operator[]((vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_> *)
                   (in_RDI + 3),local_10);
        poVar4 = doctest::operator<<(in_stack_ffffffffffffffc0,
                                     (String *)
                                     CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        std::operator<<(poVar4,"\n");
      }
    }
    sVar1 = in_RDI[6];
    sVar5 = std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::size
                      ((vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                        *)(in_RDI + 3));
    if (sVar1 != sVar5) {
      poVar4 = Color::operator<<(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      std::operator<<(poVar4,"\nDEEPEST SUBCASE STACK REACHED (DIFFERENT FROM THE CURRENT ONE):\n");
      Color::operator<<(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      local_18 = (String *)0x0;
      while (this_00 = local_18,
            pSVar6 = (String *)
                     std::
                     vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::
                     size((vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                           *)(in_RDI + 3)), this_00 < pSVar6) {
        std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::
        operator[]((vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_> *)
                   (in_RDI + 3),(size_type)local_18);
        pcVar3 = String::operator[](this_00,(uint)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
        if (*pcVar3 != '\0') {
          in_stack_ffffffffffffffc0 = std::operator<<((ostream *)in_RDI[1],"  ");
          std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::
          operator[]((vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                      *)(in_RDI + 3),(size_type)local_18);
          poVar4 = doctest::operator<<(in_stack_ffffffffffffffc0,
                                       (String *)
                                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                                      );
          std::operator<<(poVar4,"\n");
        }
        local_18 = (String *)((long)&local_18->field_0 + 1);
      }
    }
    std::operator<<((ostream *)in_RDI[1],"\n");
    *(undefined1 *)(in_RDI + 2) = 1;
  }
  return;
}

Assistant:

void logTestStart() {
            if(hasLoggedCurrentTestStart)
                return;

            separator_to_stream();
            file_line_to_stream(tc->m_file.c_str(), tc->m_line, "\n");
            if(tc->m_description)
                s << Color::Yellow << "DESCRIPTION: " << Color::None << tc->m_description << "\n";
            if(tc->m_test_suite && tc->m_test_suite[0] != '\0')
                s << Color::Yellow << "TEST SUITE: " << Color::None << tc->m_test_suite << "\n";
            if(strncmp(tc->m_name, "  Scenario:", 11) != 0)
                s << Color::Yellow << "TEST CASE:  ";
            s << Color::None << tc->m_name << "\n";

            for(size_t i = 0; i < currentSubcaseLevel; ++i) {
                if(subcasesStack[i].m_name[0] != '\0')
                    s << "  " << subcasesStack[i].m_name << "\n";
            }

            if(currentSubcaseLevel != subcasesStack.size()) {
                s << Color::Yellow << "\nDEEPEST SUBCASE STACK REACHED (DIFFERENT FROM THE CURRENT ONE):\n" << Color::None;
                for(size_t i = 0; i < subcasesStack.size(); ++i) {
                    if(subcasesStack[i].m_name[0] != '\0')
                        s << "  " << subcasesStack[i].m_name << "\n";
                }
            }

            s << "\n";

            hasLoggedCurrentTestStart = true;
        }